

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

ExprList * sqlite3ExprListAppendNew(sqlite3 *db,Expr *pExpr)

{
  ExprList *pEVar1;
  
  pEVar1 = (ExprList *)sqlite3DbMallocRawNN(db,0x80);
  if (pEVar1 == (ExprList *)0x0) {
    if (pExpr != (Expr *)0x0) {
      sqlite3ExprDeleteNN(db,pExpr);
    }
    pEVar1 = (ExprList *)0x0;
  }
  else {
    pEVar1->nExpr = 1;
    pEVar1->nAlloc = 4;
    pEVar1->a[0].pExpr = (Expr *)0x0;
    pEVar1->a[0].zEName = (char *)0x0;
    pEVar1->a[0].fg = (anon_struct_4_9_b482b7ef_for_fg)0x0;
    pEVar1->a[0].u = (anon_union_4_2_6146edf4_for_u)0x0;
    pEVar1->a[0].pExpr = pExpr;
  }
  return pEVar1;
}

Assistant:

ExprList *sqlite3ExprListAppendNew(
  sqlite3 *db,            /* Database handle.  Used for memory allocation */
  Expr *pExpr             /* Expression to be appended. Might be NULL */
){
  struct ExprList_item *pItem;
  ExprList *pList;

  pList = sqlite3DbMallocRawNN(db, sizeof(ExprList)+sizeof(pList->a[0])*4 );
  if( pList==0 ){
    sqlite3ExprDelete(db, pExpr);
    return 0;
  }
  pList->nAlloc = 4;
  pList->nExpr = 1;
  pItem = &pList->a[0];
  *pItem = zeroItem;
  pItem->pExpr = pExpr;
  return pList;
}